

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall
flatbuffers::ts::TsGenerator::TsGenerator
          (TsGenerator *this,Parser *parser,string *path,string *file_name)

{
  IdlNamer *this_00;
  _Rb_tree_header *p_Var1;
  TsGenerator *pTVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  allocator<char> local_9a0;
  allocator<char> local_99f;
  allocator<char> local_99e;
  allocator<char> local_99d;
  allocator<char> local_99c;
  allocator<char> local_99b;
  allocator_type local_99a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_999;
  allocator<char> local_998;
  allocator<char> local_997;
  allocator<char> local_996;
  allocator<char> local_995;
  allocator<char> local_994;
  allocator<char> local_993;
  allocator<char> local_992;
  allocator<char> local_991;
  allocator<char> local_990;
  allocator<char> local_98f;
  allocator<char> local_98e;
  allocator<char> local_98d;
  allocator<char> local_98c;
  allocator<char> local_98b;
  allocator<char> local_98a;
  allocator<char> local_989;
  allocator<char> local_988;
  allocator<char> local_987;
  allocator<char> local_986;
  allocator<char> local_985;
  allocator<char> local_984;
  allocator<char> local_983;
  allocator<char> local_982;
  allocator<char> local_981;
  allocator<char> local_980;
  allocator<char> local_97f;
  allocator<char> local_97e;
  allocator<char> local_97d;
  allocator<char> local_97c;
  allocator<char> local_97b;
  allocator<char> local_97a;
  allocator<char> local_979;
  allocator<char> local_978;
  allocator<char> local_977;
  allocator<char> local_976;
  allocator<char> local_975;
  allocator<char> local_974;
  allocator<char> local_973;
  allocator<char> local_972;
  allocator<char> local_971;
  TsGenerator *local_970;
  string local_968;
  string local_948;
  string local_928;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_908;
  undefined1 local_8d8 [64];
  undefined8 local_898;
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  undefined8 local_7f0;
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Config local_180;
  
  local_970 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"",(allocator<char> *)&local_780);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"_",(allocator<char> *)local_8d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"ts",&local_9a2);
  pTVar2 = local_970;
  BaseGenerator::BaseGenerator
            (&local_970->super_BaseGenerator,parser,path,file_name,&local_948,&local_968,&local_928)
  ;
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  (pTVar2->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fa948;
  local_8d8._0_4_ = kKeep;
  local_8d8._4_4_ = kUnknown;
  local_8d8._8_4_ = kLowerCamel;
  local_8d8._12_4_ = kLowerCamel;
  local_8d8._16_4_ = kLowerCamel;
  local_8d8._20_4_ = kLowerCamel;
  local_8d8._24_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_8d8 + 0x20),"::",(allocator<char> *)&local_780);
  local_898._0_4_ = AfterConvertingCase;
  local_898._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_890,"_",&local_9a2);
  std::__cxx11::string::string<std::allocator<char>>(local_870,"",&local_99b);
  std::__cxx11::string::string<std::allocator<char>>(local_850,"T",&local_99c);
  std::__cxx11::string::string<std::allocator<char>>(local_830,"",&local_99d);
  std::__cxx11::string::string<std::allocator<char>>(local_810,"_",&local_99e);
  local_7f0._0_4_ = kDasher;
  local_7f0._4_4_ = kDasher;
  std::__cxx11::string::string<std::allocator<char>>(local_7e8,"",&local_99f);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"_generated",&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,".ts",&local_9a1);
  WithFlagOptions(&local_180,(Config *)local_8d8,&parser->opts,path);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"arguments",&local_9a2);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"break",&local_99b);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"case",&local_99c);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"catch",&local_99d);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"class",&local_99e);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"const",&local_99f);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"continue",&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"debugger",&local_9a1);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"default",&local_971);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"delete",&local_972);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"do",&local_973);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"else",&local_974);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"enum",&local_975);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"export",&local_976);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"extends",&local_977);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"false",&local_978);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"finally",&local_979);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"for",&local_97a);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"function",&local_97b);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"if",&local_97c);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"import",&local_97d);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"in",&local_97e);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"instanceof",&local_97f);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"new",&local_980);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"null",&local_981);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"Object",&local_982);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"return",&local_983);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"super",&local_984);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"switch",&local_985);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"this",&local_986);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"throw",&local_987);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"true",&local_988);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"try",&local_989);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"typeof",&local_98a);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"var",&local_98b);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"void",&local_98c);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"while",&local_98d);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"with",&local_98e);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"as",&local_98f);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"implements",&local_990);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"interface",&local_991);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"let",&local_992);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"package",&local_993);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"private",&local_994);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"protected",&local_995);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"public",&local_996);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"static",&local_997);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"yield",&local_998);
  __l._M_len = 0x30;
  __l._M_array = &local_780;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_908,__l,&local_999,&local_99a);
  this_00 = &local_970->namer_;
  lVar3 = 0x5e0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_780._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  IdlNamer::IdlNamer(this_00,&local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_908);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_908);
  Namer::Config::~Config(&local_180);
  Namer::Config::~Config((Config *)local_8d8);
  p_Var1 = &(local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header;
  (local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (local_970->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TsGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "_", "ts"),
        namer_(WithFlagOptions(TypeScriptDefaultConfig(), parser.opts, path),
               TypescriptKeywords()) {}